

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fbjava.cpp
# Opt level: O0

JniRef<_jclass_*> *
findClass(JniRef<_jclass_*> *__return_storage_ptr__,JNIEnv *env,char *name,bool createGlobalRef)

{
  jclass lobj;
  _jclass *local_38;
  jclass cls;
  jclass localCls;
  bool createGlobalRef_local;
  char *name_local;
  JNIEnv *env_local;
  
  lobj = JNIEnv_::FindClass(env,name);
  local_38 = (_jclass *)0x0;
  if ((lobj != (jclass)0x0) && (local_38 = lobj, createGlobalRef)) {
    local_38 = (_jclass *)JNIEnv_::NewGlobalRef(env,(jobject)lobj);
    JNIEnv_::DeleteLocalRef(env,(jobject)lobj);
  }
  if (local_38 == (_jclass *)0x0) {
    checkJavaException(env);
  }
  JniRef<_jclass_*>::JniRef(__return_storage_ptr__,env,local_38,createGlobalRef);
  return __return_storage_ptr__;
}

Assistant:

static JniRef<jclass> findClass(JNIEnv* env, const char* name, bool createGlobalRef)
{
	const auto localCls = env->FindClass(name);
	jclass cls = nullptr;

	if (localCls)
	{
		if (createGlobalRef)
		{
			cls = (jclass) env->NewGlobalRef(localCls);
			env->DeleteLocalRef(localCls);
		}
		else
			cls = localCls;
	}

	if (!cls)
		checkJavaException(env);

	return JniRef<jclass>(env, cls, createGlobalRef);
}